

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.hpp
# Opt level: O3

status * diy::mpi::detail::recv<int>
                   (status *__return_storage_ptr__,DIY_MPI_Comm comm,int source,int tag,
                   vector<int,_std::allocator<int>_> *x)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  int c;
  status s;
  int local_4c;
  undefined1 local_48 [24];
  
  MPI_Probe(source,tag,comm.data,local_48);
  MPI_Get_count(local_48,&ompi_mpi_int,&local_4c);
  std::vector<int,_std::allocator<int>_>::resize(x,(long)local_4c);
  piVar1 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar3 = (ulong)((long)piVar2 - (long)piVar1) >> 2 & 0xffffffff;
  if (piVar2 == piVar1) {
    uVar3 = 0;
  }
  MPI_Recv(piVar1,uVar3,&ompi_mpi_int,source,tag,comm.data,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

status recv(DIY_MPI_Comm comm, int source, int tag, std::vector<T>& x)
  {
    auto s = probe(comm, source, tag);
    x.resize(static_cast<size_t>(s.count<T>()));
    return recv(comm, source, tag, address(x), count(x), datatype_of(x));
  }